

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O3

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSizeLong(UninterpretedOption_NamePart *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  sVar4 = (size_t)(*(uint *)&this->field_0 & 2);
  if ((*(uint *)&this->field_0 & 1) != 0) {
    lVar1 = *(long *)(((ulong)(this->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                      0xfffffffffffffffc) + 8);
    uVar3 = (uint)lVar1 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}